

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::Descriptor::DebugString
          (Descriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options,
          bool include_opening_clause)

{
  Edition EVar1;
  int iVar2;
  ushort *puVar3;
  FeatureSet *pFVar4;
  bool bVar5;
  FeatureSet *pFVar6;
  FieldDescriptor *pFVar7;
  Descriptor *pDVar8;
  EnumDescriptor *this_00;
  OneofDescriptor *pOVar9;
  FieldDescriptor *pFVar10;
  ExtensionRange *pEVar11;
  ReservedRange *pRVar12;
  ExtensionRangeOptions *a0;
  SymbolVisibility *visibility;
  char *pcVar13;
  int i_6;
  uint depth_00;
  AlphaNum *output;
  int i;
  int iVar14;
  long lVar15;
  int i_1;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  string_view src;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  string prefix;
  AlphaNum local_260;
  string formatted_options;
  ExtensionRangeOptions range_options;
  AlphaNum local_1a0;
  flat_hash_set<const_google::protobuf::Descriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  AlphaNum local_150;
  MessageOptions full_options;
  SourceLocationCommentPrinter comment_printer;
  
  if ((this->options_->field_0)._impl_.map_entry_ == false) {
    prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
    std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
    comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
         (pointer)&comment_printer.source_loc_.leading_comments.field_2;
    comment_printer.source_loc_.leading_comments._M_string_length = 0;
    comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
    comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
         (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
    comment_printer.source_loc_.trailing_comments._M_string_length = 0;
    comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    comment_printer.options_.include_comments = debug_string_options->include_comments;
    comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
    comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
    std::__cxx11::string::string((string *)&comment_printer.prefix_,(string *)&prefix);
    if (debug_string_options->include_comments == true) {
      comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
    }
    else {
      comment_printer.have_source_loc_ = false;
    }
    anon_unknown_24::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
    if (include_opening_clause) {
      range_options.super_Message.super_MessageLite._vptr_MessageLite =
           (_func_int **)prefix._M_string_length;
      range_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           (intptr_t)prefix._M_dataplus._M_p;
      local_150.piece_._M_len._0_4_ = (byte)this->field_0x2 & 3;
      (anonymous_namespace)::VisibilityToKeyword_abi_cxx11_
                ((string *)&local_1a0,(_anonymous_namespace_ *)&local_150,visibility);
      full_options.super_Message.super_MessageLite._vptr_MessageLite =
           (_func_int **)local_1a0.piece_._M_str;
      full_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           local_1a0.piece_._M_len;
      puVar3 = (ushort *)(this->all_names_).payload_;
      local_260.piece_._M_len = (size_t)*puVar3;
      local_260.piece_._M_str = (char *)((long)puVar3 + ~local_260.piece_._M_len);
      format_11._M_str = (char *)&range_options;
      format_11._M_len = (size_t)"$0$1message $2";
      absl::lts_20250127::SubstituteAndAppend
                ((lts_20250127 *)contents,(Nonnull<std::string_*>)0xe,format_11,(Arg *)&full_options
                 ,(Arg *)&local_260,
                 (Arg *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      std::__cxx11::string::~string((string *)&local_1a0);
    }
    std::__cxx11::string::append((char *)contents);
    MessageOptions::MessageOptions(&full_options,this->options_);
    pFVar4 = this->proto_features_;
    if (pFVar4 != (FeatureSet *)_FeatureSet_default_instance_) {
      pFVar6 = MessageOptions::mutable_features(&full_options);
      FeatureSet::CopyFrom(pFVar6,pFVar4);
    }
    depth_00 = depth + 1;
    anon_unknown_24::FormatLineOptions
              (depth_00,&full_options.super_Message,this->file_->pool_,contents);
    groups.
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 1;
    groups.
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    for (iVar14 = 0; iVar14 < this->field_count_; iVar14 = iVar14 + 1) {
      EVar1 = this->file_->edition_;
      pFVar7 = field(this,iVar14);
      if (((int)EVar1 < 1000) && (pFVar7->type_ == '\n')) {
        pFVar7 = field(this,iVar14);
        pDVar8 = FieldDescriptor::message_type(pFVar7);
        local_260.piece_._M_len = (size_t)pDVar8;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::emplace<const_google::protobuf::Descriptor_*,_0>
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>::iterator,_bool>
                    *)&range_options,
                   &groups.
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   ,(Descriptor **)&local_260);
      }
    }
    for (iVar14 = 0; iVar14 < this->extension_count_; iVar14 = iVar14 + 1) {
      EVar1 = this->file_->edition_;
      pFVar7 = extension(this,iVar14);
      if (((int)EVar1 < 1000) && (pFVar7->type_ == '\n')) {
        pFVar7 = extension(this,iVar14);
        pDVar8 = FieldDescriptor::message_type(pFVar7);
        local_260.piece_._M_len = (size_t)pDVar8;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::emplace<const_google::protobuf::Descriptor_*,_0>
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>::iterator,_bool>
                    *)&range_options,
                   &groups.
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   ,(Descriptor **)&local_260);
      }
    }
    for (iVar14 = 0; iVar14 < this->nested_type_count_; iVar14 = iVar14 + 1) {
      range_options.super_Message.super_MessageLite._vptr_MessageLite =
           (_func_int **)nested_type(this,iVar14);
      bVar5 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
              ::contains<google::protobuf::Descriptor_const*>
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
                          *)&groups,(key_arg<const_google::protobuf::Descriptor_*> *)&range_options)
      ;
      if (!bVar5) {
        pDVar8 = nested_type(this,iVar14);
        DebugString(pDVar8,depth_00,contents,debug_string_options,true);
      }
    }
    for (iVar14 = 0; iVar14 < this->enum_type_count_; iVar14 = iVar14 + 1) {
      this_00 = enum_type(this,iVar14);
      EnumDescriptor::DebugString(this_00,depth_00,contents,debug_string_options);
    }
    for (iVar14 = 0; iVar14 < this->field_count_; iVar14 = iVar14 + 1) {
      pFVar7 = field(this,iVar14);
      pOVar9 = FieldDescriptor::real_containing_oneof(pFVar7);
      if (pOVar9 == (OneofDescriptor *)0x0) {
        pFVar7 = field(this,iVar14);
        FieldDescriptor::DebugString(pFVar7,depth_00,contents,debug_string_options);
      }
      else {
        pFVar7 = field(this,iVar14);
        pOVar9 = FieldDescriptor::containing_oneof(pFVar7);
        pFVar7 = OneofDescriptor::field(pOVar9,0);
        pFVar10 = field(this,iVar14);
        if (pFVar7 == pFVar10) {
          pFVar7 = field(this,iVar14);
          pOVar9 = FieldDescriptor::containing_oneof(pFVar7);
          OneofDescriptor::DebugString(pOVar9,depth_00,contents,debug_string_options);
        }
      }
    }
    for (iVar14 = 0; iVar14 < this->extension_range_count_; iVar14 = iVar14 + 1) {
      range_options.super_Message.super_MessageLite._vptr_MessageLite =
           (_func_int **)prefix._M_string_length;
      range_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           (intptr_t)prefix._M_dataplus._M_p;
      pEVar11 = extension_range(this,iVar14);
      absl::lts_20250127::substitute_internal::Arg::Arg((Arg *)&local_260,pEVar11->start_);
      format._M_str = "$0  extensions $1";
      format._M_len = 0x11;
      output = &local_260;
      absl::lts_20250127::SubstituteAndAppend
                (contents,format,(Arg *)&range_options,(Arg *)&local_260);
      pEVar11 = extension_range(this,iVar14);
      iVar2 = pEVar11->end_;
      pEVar11 = extension_range(this,iVar14);
      if (pEVar11->start_ + 1 < iVar2) {
        pEVar11 = extension_range(this,iVar14);
        absl::lts_20250127::substitute_internal::Arg::Arg((Arg *)&range_options,pEVar11->end_ + -1);
        format_00._M_str = " to $0";
        format_00._M_len = 6;
        absl::lts_20250127::SubstituteAndAppend(contents,format_00,(Arg *)&range_options);
      }
      pEVar11 = extension_range(this,iVar14);
      ExtensionRangeOptions::ExtensionRangeOptions(&range_options,pEVar11->options_);
      pEVar11 = extension_range(this,iVar14);
      pFVar4 = pEVar11->proto_features_;
      if (pFVar4 != (FeatureSet *)_FeatureSet_default_instance_) {
        pFVar6 = ExtensionRangeOptions::mutable_features(&range_options);
        FeatureSet::CopyFrom(pFVar6,pFVar4);
      }
      formatted_options._M_dataplus._M_p = (pointer)&formatted_options.field_2;
      formatted_options._M_string_length = 0;
      formatted_options.field_2._M_local_buf[0] = '\0';
      bVar5 = anon_unknown_24::FormatBracketedOptions
                        ((anon_unknown_24 *)(ulong)depth_00,(int)&range_options,
                         (Message *)this->file_->pool_,(DescriptorPool *)&formatted_options,
                         (string *)output);
      if (bVar5) {
        local_260.piece_ = absl::lts_20250127::NullSafeStringView(" [");
        local_1a0.piece_._M_len = formatted_options._M_string_length;
        local_1a0.piece_._M_str = formatted_options._M_dataplus._M_p;
        local_150.piece_ = absl::lts_20250127::NullSafeStringView("]");
        absl::lts_20250127::StrAppend(contents,&local_260,&local_1a0,&local_150);
      }
      local_260.piece_ = absl::lts_20250127::NullSafeStringView(";\n");
      absl::lts_20250127::StrAppend(contents,&local_260);
      std::__cxx11::string::~string((string *)&formatted_options);
      ExtensionRangeOptions::~ExtensionRangeOptions(&range_options);
    }
    pDVar8 = (Descriptor *)0x0;
    for (iVar14 = 0; iVar14 < this->extension_count_; iVar14 = iVar14 + 1) {
      pFVar7 = extension(this,iVar14);
      if (pFVar7->containing_type_ != pDVar8) {
        if (iVar14 != 0) {
          range_options.super_Message.super_MessageLite._vptr_MessageLite =
               (_func_int **)prefix._M_string_length;
          range_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
               (intptr_t)prefix._M_dataplus._M_p;
          format_01._M_str = "$0  }\n";
          format_01._M_len = 6;
          absl::lts_20250127::SubstituteAndAppend(contents,format_01,(Arg *)&range_options);
        }
        pFVar7 = extension(this,iVar14);
        pDVar8 = pFVar7->containing_type_;
        range_options.super_Message.super_MessageLite._vptr_MessageLite =
             (_func_int **)prefix._M_string_length;
        range_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
             (intptr_t)prefix._M_dataplus._M_p;
        pcVar13 = (pDVar8->all_names_).payload_;
        local_260.piece_._M_len = (size_t)*(ushort *)(pcVar13 + 2);
        local_260.piece_._M_str = pcVar13 + ~local_260.piece_._M_len;
        format_02._M_str = "$0  extend .$1 {\n";
        format_02._M_len = 0x11;
        absl::lts_20250127::SubstituteAndAppend
                  (contents,format_02,(Arg *)&range_options,(Arg *)&local_260);
      }
      pFVar7 = extension(this,iVar14);
      FieldDescriptor::DebugString(pFVar7,depth + 2,contents,debug_string_options);
    }
    if (0 < this->extension_count_) {
      range_options.super_Message.super_MessageLite._vptr_MessageLite =
           (_func_int **)prefix._M_string_length;
      range_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           (intptr_t)prefix._M_dataplus._M_p;
      format_03._M_str = "$0  }\n";
      format_03._M_len = 6;
      absl::lts_20250127::SubstituteAndAppend(contents,format_03,(Arg *)&range_options);
    }
    if (0 < this->reserved_range_count_) {
      range_options.super_Message.super_MessageLite._vptr_MessageLite =
           (_func_int **)prefix._M_string_length;
      range_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           (intptr_t)prefix._M_dataplus._M_p;
      format_04._M_str = "$0  reserved ";
      format_04._M_len = 0xd;
      absl::lts_20250127::SubstituteAndAppend(contents,format_04,(Arg *)&range_options);
      for (iVar14 = 0; iVar14 < this->reserved_range_count_; iVar14 = iVar14 + 1) {
        pRVar12 = reserved_range(this,iVar14);
        iVar2 = pRVar12->start;
        if (pRVar12->end == iVar2 + 1) {
          absl::lts_20250127::substitute_internal::Arg::Arg((Arg *)&range_options,iVar2);
          format_05._M_str = "$0, ";
          format_05._M_len = 4;
          absl::lts_20250127::SubstituteAndAppend(contents,format_05,(Arg *)&range_options);
        }
        else if (pRVar12->end < 0x20000000) {
          absl::lts_20250127::substitute_internal::Arg::Arg((Arg *)&range_options,iVar2);
          absl::lts_20250127::substitute_internal::Arg::Arg((Arg *)&local_260,pRVar12->end + -1);
          format_07._M_str = "$0 to $1, ";
          format_07._M_len = 10;
          absl::lts_20250127::SubstituteAndAppend
                    (contents,format_07,(Arg *)&range_options,(Arg *)&local_260);
        }
        else {
          absl::lts_20250127::substitute_internal::Arg::Arg((Arg *)&range_options,iVar2);
          format_06._M_str = "$0 to max, ";
          format_06._M_len = 0xb;
          absl::lts_20250127::SubstituteAndAppend(contents,format_06,(Arg *)&range_options);
        }
      }
      std::__cxx11::string::replace((ulong)contents,contents->_M_string_length - 2,(char *)0x2);
    }
    if (0 < this->reserved_name_count_) {
      a0 = &range_options;
      range_options.super_Message.super_MessageLite._vptr_MessageLite =
           (_func_int **)prefix._M_string_length;
      range_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           (intptr_t)prefix._M_dataplus._M_p;
      format_08._M_str = "$0  reserved ";
      format_08._M_len = 0xd;
      absl::lts_20250127::SubstituteAndAppend(contents,format_08,(Arg *)a0);
      for (lVar15 = 0; lVar15 < this->reserved_name_count_; lVar15 = lVar15 + 1) {
        EVar1 = this->file_->edition_;
        src._M_str = (char *)a0;
        src._M_len = (size_t)(this->reserved_names_[lVar15]->_M_dataplus)._M_p;
        absl::lts_20250127::CEscape_abi_cxx11_
                  ((string *)&local_260,
                   (lts_20250127 *)this->reserved_names_[lVar15]->_M_string_length,src);
        pcVar13 = "$0, ";
        if ((int)EVar1 < 1000) {
          pcVar13 = "\"$0\", ";
        }
        range_options.super_Message.super_MessageLite._vptr_MessageLite =
             (_func_int **)local_260.piece_._M_str;
        range_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
             local_260.piece_._M_len;
        format_09._M_str = pcVar13;
        format_09._M_len = (ulong)((int)EVar1 < 1000) * 2 + 4;
        a0 = &range_options;
        absl::lts_20250127::SubstituteAndAppend(contents,format_09,(Arg *)&range_options);
        std::__cxx11::string::~string((string *)&local_260);
      }
      std::__cxx11::string::replace((ulong)contents,contents->_M_string_length - 2,(char *)0x2);
    }
    range_options.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)prefix._M_string_length;
    range_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         (intptr_t)prefix._M_dataplus._M_p;
    format_10._M_str = "$0}\n";
    format_10._M_len = 4;
    absl::lts_20250127::SubstituteAndAppend(contents,format_10,(Arg *)&range_options);
    anon_unknown_24::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::~raw_hash_set(&groups.
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   );
    MessageOptions::~MessageOptions(&full_options);
    anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(&comment_printer);
    std::__cxx11::string::~string((string *)&prefix);
  }
  return;
}

Assistant:

void Descriptor::DebugString(int depth, std::string* contents,
                             const DebugStringOptions& debug_string_options,
                             bool include_opening_clause) const {
  if (options().map_entry()) {
    // Do not generate debug string for auto-generated map-entry type.
    return;
  }
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  if (include_opening_clause) {
    absl::SubstituteAndAppend(contents, "$0$1message $2", prefix,
                              VisibilityToKeyword(visibility_keyword()),
                              name());
  }
  contents->append(" {\n");

  MessageOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  FormatLineOptions(depth, full_options, file()->pool(), contents);

  // Find all the 'group' types for fields and extensions; we will not output
  // their nested definitions (those will be done with their group field
  // descriptor).
  absl::flat_hash_set<const Descriptor*> groups;
  for (int i = 0; i < field_count(); i++) {
    if (IsGroupSyntax(file()->edition(), field(i))) {
      groups.insert(field(i)->message_type());
    }
  }
  for (int i = 0; i < extension_count(); i++) {
    if (IsGroupSyntax(file()->edition(), extension(i))) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < nested_type_count(); i++) {
    if (!groups.contains(nested_type(i))) {
      nested_type(i)->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ true);
    }
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(depth, contents, debug_string_options);
  }
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->real_containing_oneof() == nullptr) {
      field(i)->DebugString(depth, contents, debug_string_options);
    } else if (field(i)->containing_oneof()->field(0) == field(i)) {
      // This is the first field in this oneof, so print the whole oneof.
      field(i)->containing_oneof()->DebugString(depth, contents,
                                                debug_string_options);
    }
  }

  for (int i = 0; i < extension_range_count(); i++) {
    absl::SubstituteAndAppend(contents, "$0  extensions $1", prefix,
                              extension_range(i)->start_number());
    if (extension_range(i)->end_number() >
        extension_range(i)->start_number() + 1) {
      absl::SubstituteAndAppend(contents, " to $0",
                                extension_range(i)->end_number() - 1);
    }
    ExtensionRangeOptions range_options = extension_range(i)->options();
    CopyFeaturesToOptions(extension_range(i)->proto_features_, &range_options);
    std::string formatted_options;
    if (FormatBracketedOptions(depth, range_options, file()->pool(),
                               &formatted_options)) {
      absl::StrAppend(contents, " [", formatted_options, "]");
    }
    absl::StrAppend(contents, ";\n");
  }

  // Group extensions by what they extend, so they can be printed out together.
  const Descriptor* containing_type = nullptr;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) absl::SubstituteAndAppend(contents, "$0  }\n", prefix);
      containing_type = extension(i)->containing_type();
      absl::SubstituteAndAppend(contents, "$0  extend .$1 {\n", prefix,
                                containing_type->full_name());
    }
    extension(i)->DebugString(depth + 1, contents, debug_string_options);
  }
  if (extension_count() > 0)
    absl::SubstituteAndAppend(contents, "$0  }\n", prefix);

  if (reserved_range_count() > 0) {
    absl::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const Descriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start + 1) {
        absl::SubstituteAndAppend(contents, "$0, ", range->start);
      } else if (range->end > FieldDescriptor::kMaxNumber) {
        absl::SubstituteAndAppend(contents, "$0 to max, ", range->start);
      } else {
        absl::SubstituteAndAppend(contents, "$0 to $1, ", range->start,
                                  range->end - 1);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    absl::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      absl::SubstituteAndAppend(
          contents,
          file()->edition() < Edition::EDITION_2023 ? "\"$0\", " : "$0, ",
          absl::CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  absl::SubstituteAndAppend(contents, "$0}\n", prefix);
  comment_printer.AddPostComment(contents);
}